

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

bool __thiscall
EnvironmentNAVXYTHETALATTICE::ReadinMotionPrimitive
          (EnvironmentNAVXYTHETALATTICE *this,SBPL_xytheta_mprimitive *pMotPrim,FILE *fIn)

{
  double dVar1;
  pointer psVar2;
  double dVar3;
  int iVar4;
  int i;
  int iVar5;
  int dTemp;
  float fTemp;
  int numofIntermPoses;
  sbpl_xy_theta_pt_t intermpose;
  char sExpected [1024];
  char sTemp [1024];
  int local_87c;
  float local_878;
  int local_874;
  double local_870;
  double local_868;
  double local_860;
  value_type local_858;
  char local_838 [1024];
  char local_438 [1032];
  
  builtin_strncpy(local_838,"primID:",8);
  iVar4 = __isoc99_fscanf(fIn,"%s",local_438);
  if (iVar4 == 0) {
    return false;
  }
  iVar4 = strcmp(local_438,local_838);
  if (iVar4 == 0) {
    iVar4 = __isoc99_fscanf(fIn,"%d",pMotPrim);
    if (iVar4 != 1) {
      return false;
    }
    builtin_strncpy(local_838,"startangle_c:",0xe);
    iVar4 = __isoc99_fscanf(fIn,"%s",local_438);
    if (iVar4 == 0) {
      return false;
    }
    iVar4 = strcmp(local_438,local_838);
    if (iVar4 == 0) {
      iVar4 = __isoc99_fscanf(fIn,"%d",&local_87c);
      if (iVar4 == 0) {
        return false;
      }
      pMotPrim->starttheta_c = (uchar)local_87c;
      builtin_strncpy(local_838,"endpose_c:",0xb);
      iVar4 = __isoc99_fscanf(fIn,"%s",local_438);
      if (iVar4 == 0) {
        return false;
      }
      iVar4 = strcmp(local_438,local_838);
      if ((iVar4 == 0) &&
         (iVar4 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x4f])
                            (this,&pMotPrim->endcell,fIn), (char)iVar4 != '\0')) {
        builtin_strncpy(local_838,"additionalactioncostmult:",0x1a);
        iVar4 = __isoc99_fscanf(fIn,"%s",local_438);
        if (iVar4 == 0) {
          return false;
        }
        iVar4 = strcmp(local_438,local_838);
        if (iVar4 == 0) {
          iVar4 = __isoc99_fscanf(fIn,"%d",&local_87c);
          if (iVar4 != 1) {
            return false;
          }
          pMotPrim->additionalactioncostmult = local_87c;
          if (this->bUseNonUniformAngles == true) {
            builtin_strncpy(local_838,"turning_radius:",0x10);
            iVar4 = __isoc99_fscanf(fIn,"%s",local_438);
            if (iVar4 == 0) {
              return false;
            }
            iVar4 = strcmp(local_438,local_838);
            if (iVar4 != 0) {
              return false;
            }
            iVar4 = __isoc99_fscanf(fIn,"%f",&local_878);
            if (iVar4 != 1) {
              return false;
            }
            pMotPrim->turning_radius = (double)local_878;
          }
          builtin_strncpy(local_838,"intermediateposes:",0x13);
          iVar4 = __isoc99_fscanf(fIn,"%s",local_438);
          if (iVar4 == 0) {
            return false;
          }
          iVar4 = strcmp(local_438,local_838);
          if (iVar4 == 0) {
            iVar5 = 0;
            iVar4 = __isoc99_fscanf(fIn,"%d",&local_874);
            if (iVar4 != 1) {
              return false;
            }
            for (; iVar5 < local_874; iVar5 = iVar5 + 1) {
              local_858.x = 0.0;
              local_858.y = 0.0;
              local_858.theta = 0.0;
              iVar4 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x50])
                                (this,&local_858,fIn);
              if ((char)iVar4 == '\0') {
                return false;
              }
              std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::push_back
                        (&pMotPrim->intermptV,&local_858);
            }
            dVar1 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
            local_870 = dVar1 * 0.0 + dVar1 * 0.5;
            (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])
                      (this,(ulong)pMotPrim->starttheta_c);
            psVar2 = (pMotPrim->intermptV).
                     super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            dVar1 = psVar2[-1].x + local_870;
            local_860 = psVar2[-1].y;
            local_868 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
            dVar3 = dVar1 / local_868;
            iVar4 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x21])
                              (SUB84(psVar2[-1].theta,0),this);
            if (((int)dVar3 - (uint)(dVar1 < 0.0) == (pMotPrim->endcell).x) &&
               ((int)((local_870 + local_860) / local_868) - (uint)(local_870 + local_860 < 0.0) ==
                (pMotPrim->endcell).y)) {
              return iVar4 == (pMotPrim->endcell).theta;
            }
          }
        }
      }
    }
  }
  else {
    fflush(_stdout);
  }
  return false;
}

Assistant:

bool EnvironmentNAVXYTHETALATTICE::ReadinMotionPrimitive(
    SBPL_xytheta_mprimitive* pMotPrim,
    FILE* fIn)
{
    char sTemp[1024];
    int dTemp;
    char sExpected[1024];
    int numofIntermPoses;
    float fTemp;

    // read in actionID
    strcpy(sExpected, "primID:");
    if (fscanf(fIn, "%s", sTemp) == 0) {
        return false;
    }
    if (strcmp(sTemp, sExpected) != 0) {
        SBPL_ERROR("ERROR: expected %s but got %s\n", sExpected, sTemp);
        fflush(stdout);
        return false;
    }
    if (fscanf(fIn, "%d", &pMotPrim->motprimID) != 1) {
        return false;
    }

    // read in start angle
    strcpy(sExpected, "startangle_c:");
    if (fscanf(fIn, "%s", sTemp) == 0) {
        return false;
    }
    if (strcmp(sTemp, sExpected) != 0) {
        SBPL_ERROR("ERROR: expected %s but got %s\n", sExpected, sTemp);
        return false;
    }
    if (fscanf(fIn, "%d", &dTemp) == 0) {
        SBPL_ERROR("ERROR reading startangle\n");
        return false;
    }
    pMotPrim->starttheta_c = dTemp;

    // read in end pose
    strcpy(sExpected, "endpose_c:");
    if (fscanf(fIn, "%s", sTemp) == 0) {
        return false;
    }
    if (strcmp(sTemp, sExpected) != 0) {
        SBPL_ERROR("ERROR: expected %s but got %s\n", sExpected, sTemp);
        return false;
    }

    if (ReadinCell(&pMotPrim->endcell, fIn) == false) {
        SBPL_ERROR("ERROR: failed to read in endsearchpose\n");
        return false;
    }

    // read in action cost
    strcpy(sExpected, "additionalactioncostmult:");
    if (fscanf(fIn, "%s", sTemp) == 0) {
        return false;
    }
    if (strcmp(sTemp, sExpected) != 0) {
        SBPL_ERROR("ERROR: expected %s but got %s\n", sExpected, sTemp);
        return false;
    }
    if (fscanf(fIn, "%d", &dTemp) != 1) {
        return false;
    }
    pMotPrim->additionalactioncostmult = dTemp;

    if (bUseNonUniformAngles) {
        // read in action turning radius
        strcpy(sExpected, "turning_radius:");
        if (fscanf(fIn, "%s", sTemp) == 0) {
            return false;
        }
        if (strcmp(sTemp, sExpected) != 0) {
            SBPL_ERROR("ERROR: expected %s but got %s\n", sExpected, sTemp);
            return false;
        }
        if (fscanf(fIn, "%f", &fTemp) != 1) {
            return false;
        }
        pMotPrim->turning_radius = fTemp;
    }

    // read in intermediate poses
    strcpy(sExpected, "intermediateposes:");
    if (fscanf(fIn, "%s", sTemp) == 0) {
        return false;
    }
    if (strcmp(sTemp, sExpected) != 0) {
        SBPL_ERROR("ERROR: expected %s but got %s\n", sExpected, sTemp);
        return false;
    }
    if (fscanf(fIn, "%d", &numofIntermPoses) != 1) {
        return false;
    }
    // all intermposes should be with respect to 0,0 as starting pose since it
    // will be added later and should be done after the action is rotated by
    // initial orientation
    for (int i = 0; i < numofIntermPoses; i++) {
        sbpl_xy_theta_pt_t intermpose;
        if (ReadinPose(&intermpose, fIn) == false) {
            SBPL_ERROR("ERROR: failed to read in intermediate poses\n");
            return false;
        }
        pMotPrim->intermptV.push_back(intermpose);
    }

    // Check that the last pose of the motion matches (within lattice
    // resolution) the designated end pose of the primitive
    sbpl_xy_theta_pt_t sourcepose;
    sourcepose.x = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
    sourcepose.y = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
    sourcepose.theta = DiscTheta2ContNew(pMotPrim->starttheta_c);
    double mp_endx_m = sourcepose.x + pMotPrim->intermptV[pMotPrim->intermptV.size() - 1].x;
    double mp_endy_m = sourcepose.y + pMotPrim->intermptV[pMotPrim->intermptV.size() - 1].y;
    double mp_endtheta_rad = pMotPrim->intermptV[pMotPrim->intermptV.size() - 1].theta;

    int endtheta_c;
    int endx_c = CONTXY2DISC(mp_endx_m, EnvNAVXYTHETALATCfg.cellsize_m);
    int endy_c = CONTXY2DISC(mp_endy_m, EnvNAVXYTHETALATCfg.cellsize_m);
    endtheta_c = ContTheta2DiscNew(mp_endtheta_rad);
    if (endx_c != pMotPrim->endcell.x ||
        endy_c != pMotPrim->endcell.y ||
        endtheta_c != pMotPrim->endcell.theta)
    {
        SBPL_ERROR( "ERROR: incorrect primitive %d with startangle=%d "
                   "last interm point %f %f %f does not match end pose %d %d %d\n",
                   pMotPrim->motprimID, pMotPrim->starttheta_c,
                   pMotPrim->intermptV[pMotPrim->intermptV.size() - 1].x,
                   pMotPrim->intermptV[pMotPrim->intermptV.size() - 1].y,
                   pMotPrim->intermptV[pMotPrim->intermptV.size() - 1].theta,
                   pMotPrim->endcell.x, pMotPrim->endcell.y,
                   pMotPrim->endcell.theta);
        SBPL_FFLUSH(stdout);
        return false;
    }

    return true;
}